

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

bool __thiscall QGles2ShaderResourceBindings::create(QGles2ShaderResourceBindings *this)

{
  bool bVar1;
  size_type sVar2;
  QRhiShaderResourceBinding *binding;
  QRhiShaderResourceBindings *in_RDI;
  QRhiImplementation *unaff_retaddr;
  Data *b;
  int ie;
  int i;
  QRhiGles2 *rhiD;
  qsizetype in_stack_ffffffffffffffc8;
  QRhiImplementation *in_stack_ffffffffffffffd8;
  int iVar3;
  undefined1 ownsNativeResources;
  QRhiImplementation *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_00 = (in_RDI->super_QRhiResource).m_rhi;
  bVar1 = QRhiImplementation::sanityCheckShaderResourceBindings(this_00,in_RDI);
  if (bVar1) {
    *(undefined1 *)&in_RDI[1].super_QRhiResource._vptr_QRhiResource = 0;
    iVar3 = 0;
    sVar2 = QVLABaseBase::size((QVLABaseBase *)&in_RDI->m_bindings);
    for (; iVar3 != (int)sVar2; iVar3 = iVar3 + 1) {
      binding = QVarLengthArray<QRhiShaderResourceBinding,_12LL>::at
                          ((QVarLengthArray<QRhiShaderResourceBinding,_12LL> *)in_RDI,
                           in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffd8 =
           (QRhiImplementation *)QRhiImplementation::shaderResourceBindingData(binding);
      if ((*(Type *)&in_stack_ffffffffffffffd8->q == UniformBuffer) &&
         (((ulong)in_stack_ffffffffffffffd8->requestedRhiAdapter & 1) != 0)) {
        *(undefined1 *)&in_RDI[1].super_QRhiResource._vptr_QRhiResource = 1;
        break;
      }
    }
    ownsNativeResources = (undefined1)((uint)iVar3 >> 0x18);
    QRhiImplementation::updateLayoutDesc
              (unaff_retaddr,
               (QRhiShaderResourceBindings *)
               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    *(int *)((long)&in_RDI[1].super_QRhiResource._vptr_QRhiResource + 4) =
         *(int *)((long)&in_RDI[1].super_QRhiResource._vptr_QRhiResource + 4) + 1;
    QRhiImplementation::registerResource
              (in_stack_ffffffffffffffd8,(QRhiResource *)this_00,(bool)ownsNativeResources);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool QGles2ShaderResourceBindings::create()
{
    QRHI_RES_RHI(QRhiGles2);
    if (!rhiD->sanityCheckShaderResourceBindings(this))
        return false;

    hasDynamicOffset = false;
    for (int i = 0, ie = m_bindings.size(); i != ie; ++i) {
        const QRhiShaderResourceBinding::Data *b = QRhiImplementation::shaderResourceBindingData(m_bindings.at(i));
        if (b->type == QRhiShaderResourceBinding::UniformBuffer) {
            if (b->u.ubuf.hasDynamicOffset) {
                hasDynamicOffset = true;
                break;
            }
        }
    }

    rhiD->updateLayoutDesc(this);

    generation += 1;
    rhiD->registerResource(this, false);
    return true;
}